

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

bool doctest::anon_unknown_15::parseOptionImpl(int argc,char **argv,char *pattern,String *value)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  ulong uVar9;
  anon_union_24_2_13149d16_for_String_3 local_50;
  char **local_38;
  
  bVar8 = 0 < argc;
  if (0 < argc) {
    uVar9 = (ulong)(uint)argc;
    local_38 = argv;
    do {
      pcVar7 = local_38[uVar9 - 1];
      pcVar3 = strstr(pcVar7,pattern);
      if (pcVar3 != (char *)0x0) {
        pcVar6 = pcVar7;
        if (value == (String *)0x0) {
          sVar4 = strlen(pcVar3);
          sVar5 = strlen(pattern);
          if (sVar4 != sVar5) goto LAB_00110c47;
        }
        do {
          if (pcVar6 == pcVar3) {
            if (*pcVar7 == '-') {
              if (value == (String *)0x0) {
                return bVar8;
              }
              sVar4 = strlen(pattern);
              pcVar3 = pcVar3 + sVar4;
              sVar4 = strlen(pcVar3);
              if ((int)sVar4 != 0) {
                sVar4 = strlen(pcVar3);
                pcVar7 = String::allocate((String *)&local_50.data,(size_type)sVar4);
                memcpy(pcVar7,pcVar3,sVar4 & 0xffffffff);
                if (&local_50 != &value->field_0) {
                  if (((value->field_0).buf[0x17] < '\0') &&
                     (pcVar7 = (value->field_0).data.ptr, pcVar7 != (char *)0x0)) {
                    operator_delete__(pcVar7);
                  }
                  *(ulong *)((long)&value->field_0 + 0x10) =
                       CONCAT17(local_50.buf[0x17],local_50._16_7_);
                  (value->field_0).data.ptr = (char *)CONCAT71(local_50._1_7_,local_50.buf[0]);
                  *(undefined8 *)((long)&value->field_0 + 8) = local_50._8_8_;
                  local_50.buf[0] = '\0';
                  local_50.buf[0x17] = '\x17';
                }
                if (-1 < local_50.buf[0x17]) {
                  return bVar8;
                }
                if ((void *)CONCAT71(local_50._1_7_,local_50.buf[0]) == (void *)0x0) {
                  return bVar8;
                }
                operator_delete__((void *)CONCAT71(local_50._1_7_,local_50.buf[0]));
                return bVar8;
              }
            }
            break;
          }
          cVar1 = *pcVar6;
          pcVar6 = pcVar6 + 1;
        } while (cVar1 == '-');
      }
LAB_00110c47:
      bVar8 = 1 < (long)uVar9;
      bVar2 = 1 < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar2);
  }
  return bVar8;
}

Assistant:

bool parseOptionImpl(int argc, const char* const* argv, const char* pattern, String* value) {
        // going from the end to the beginning and stopping on the first occurrence from the end
        for(int i = argc; i > 0; --i) {
            auto index = i - 1;
            auto temp = std::strstr(argv[index], pattern);
            if(temp && (value || strlen(temp) == strlen(pattern))) { //!OCLINT prefer early exits and continue
                // eliminate matches in which the chars before the option are not '-'
                bool noBadCharsFound = true;
                auto curr            = argv[index];
                while(curr != temp) {
                    if(*curr++ != '-') {
                        noBadCharsFound = false;
                        break;
                    }
                }
                if(noBadCharsFound && argv[index][0] == '-') {
                    if(value) {
                        // parsing the value of an option
                        temp += strlen(pattern);
                        const unsigned len = strlen(temp);
                        if(len) {
                            *value = temp;
                            return true;
                        }
                    } else {
                        // just a flag - no value
                        return true;
                    }
                }
            }
        }
        return false;
    }